

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  NodeRef *pNVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  NodeRef *pNVar26;
  ulong uVar27;
  ulong uVar28;
  size_t sVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  float fVar41;
  float fVar43;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar47;
  float fVar57;
  float fVar58;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar60;
  float fVar64;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar84 [16];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  NodeRef *local_b30;
  long local_b00;
  undefined1 local_a88 [16];
  undefined1 (*local_a78) [16];
  long local_a70;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar89 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar106 = fVar80 * 0.99999964;
  fVar115 = fVar82 * 0.99999964;
  fVar95 = fVar89 * 0.99999964;
  fVar80 = fVar80 * 1.0000004;
  fVar82 = fVar82 * 1.0000004;
  fVar89 = fVar89 * 1.0000004;
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  iVar9 = (tray->tfar).field_0.i[k];
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_b30 = stack + 1;
LAB_006f1408:
  do {
    pNVar26 = local_b30;
    if (pNVar26 == stack) {
LAB_006f1deb:
      return pNVar26 != stack;
    }
    pNVar22 = pNVar26 + -1;
    sVar29 = pNVar26[-1].ptr;
    local_b30 = pNVar22;
    while ((sVar29 & 8) == 0) {
      pfVar1 = (float *)(sVar29 + 0x20 + uVar28);
      auVar52._0_4_ = (*pfVar1 - fVar5) * fVar106;
      auVar52._4_4_ = (pfVar1[1] - fVar5) * fVar106;
      auVar52._8_4_ = (pfVar1[2] - fVar5) * fVar106;
      auVar52._12_4_ = (pfVar1[3] - fVar5) * fVar106;
      pfVar1 = (float *)(sVar29 + 0x20 + uVar24);
      auVar48._0_4_ = (*pfVar1 - fVar6) * fVar115;
      auVar48._4_4_ = (pfVar1[1] - fVar6) * fVar115;
      auVar48._8_4_ = (pfVar1[2] - fVar6) * fVar115;
      auVar48._12_4_ = (pfVar1[3] - fVar6) * fVar115;
      auVar33 = maxps(auVar52,auVar48);
      pfVar1 = (float *)(sVar29 + 0x20 + uVar30);
      auVar49._0_4_ = (*pfVar1 - fVar7) * fVar95;
      auVar49._4_4_ = (pfVar1[1] - fVar7) * fVar95;
      auVar49._8_4_ = (pfVar1[2] - fVar7) * fVar95;
      auVar49._12_4_ = (pfVar1[3] - fVar7) * fVar95;
      auVar50._4_4_ = iVar8;
      auVar50._0_4_ = iVar8;
      auVar50._8_4_ = iVar8;
      auVar50._12_4_ = iVar8;
      auVar50 = maxps(auVar49,auVar50);
      auVar50 = maxps(auVar33,auVar50);
      pfVar1 = (float *)(sVar29 + 0x20 + (uVar28 ^ 0x10));
      auVar51._0_4_ = (*pfVar1 - fVar5) * fVar80;
      auVar51._4_4_ = (pfVar1[1] - fVar5) * fVar80;
      auVar51._8_4_ = (pfVar1[2] - fVar5) * fVar80;
      auVar51._12_4_ = (pfVar1[3] - fVar5) * fVar80;
      pfVar1 = (float *)(sVar29 + 0x20 + (uVar24 ^ 0x10));
      auVar61._0_4_ = (*pfVar1 - fVar6) * fVar82;
      auVar61._4_4_ = (pfVar1[1] - fVar6) * fVar82;
      auVar61._8_4_ = (pfVar1[2] - fVar6) * fVar82;
      auVar61._12_4_ = (pfVar1[3] - fVar6) * fVar82;
      auVar52 = minps(auVar51,auVar61);
      pfVar1 = (float *)(sVar29 + 0x20 + (uVar30 ^ 0x10));
      auVar62._0_4_ = (*pfVar1 - fVar7) * fVar89;
      auVar62._4_4_ = (pfVar1[1] - fVar7) * fVar89;
      auVar62._8_4_ = (pfVar1[2] - fVar7) * fVar89;
      auVar62._12_4_ = (pfVar1[3] - fVar7) * fVar89;
      auVar33._4_4_ = iVar9;
      auVar33._0_4_ = iVar9;
      auVar33._8_4_ = iVar9;
      auVar33._12_4_ = iVar9;
      auVar33 = minps(auVar62,auVar33);
      auVar33 = minps(auVar52,auVar33);
      auVar34._4_4_ = -(uint)(auVar50._4_4_ <= auVar33._4_4_);
      auVar34._0_4_ = -(uint)(auVar50._0_4_ <= auVar33._0_4_);
      auVar34._8_4_ = -(uint)(auVar50._8_4_ <= auVar33._8_4_);
      auVar34._12_4_ = -(uint)(auVar50._12_4_ <= auVar33._12_4_);
      uVar20 = movmskps((int)pNVar22,auVar34);
      if (uVar20 == 0) goto LAB_006f1408;
      uVar20 = uVar20 & 0xff;
      pNVar22 = (NodeRef *)(sVar29 & 0xfffffffffffffff0);
      lVar23 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      sVar29 = pNVar22[lVar23].ptr;
      uVar20 = uVar20 - 1 & uVar20;
      uVar25 = (ulong)uVar20;
      if (uVar20 != 0) {
        do {
          local_b30->ptr = sVar29;
          local_b30 = local_b30 + 1;
          lVar23 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
            }
          }
          sVar29 = pNVar22[lVar23].ptr;
          uVar25 = uVar25 - 1 & uVar25;
        } while (uVar25 != 0);
      }
    }
    local_a70 = (ulong)((uint)sVar29 & 0xf) - 8;
    uVar25 = sVar29 & 0xfffffffffffffff0;
    for (local_b00 = 0; local_b00 != local_a70; local_b00 = local_b00 + 1) {
      lVar23 = local_b00 * 0xb0;
      fVar46 = *(float *)(ray + k * 4);
      fVar72 = *(float *)(ray + k * 4 + 0x10);
      fVar88 = *(float *)(ray + k * 4 + 0x20);
      pfVar1 = (float *)(uVar25 + lVar23);
      pfVar2 = (float *)(uVar25 + 0x10 + lVar23);
      pfVar3 = (float *)(uVar25 + 0x20 + lVar23);
      pfVar4 = (float *)(uVar25 + 0x30 + lVar23);
      fVar141 = *pfVar1 - fVar46;
      fVar142 = pfVar1[1] - fVar46;
      fVar143 = pfVar1[2] - fVar46;
      fVar144 = pfVar1[3] - fVar46;
      fVar107 = *pfVar2 - fVar72;
      fVar109 = pfVar2[1] - fVar72;
      fVar111 = pfVar2[2] - fVar72;
      fVar113 = pfVar2[3] - fVar72;
      fVar129 = *pfVar3 - fVar88;
      fVar131 = pfVar3[1] - fVar88;
      fVar133 = pfVar3[2] - fVar88;
      fVar135 = pfVar3[3] - fVar88;
      fVar31 = *pfVar4 - fVar46;
      fVar41 = pfVar4[1] - fVar46;
      fVar43 = pfVar4[2] - fVar46;
      fVar45 = pfVar4[3] - fVar46;
      pfVar1 = (float *)(uVar25 + 0x40 + lVar23);
      fVar60 = *pfVar1 - fVar72;
      fVar64 = pfVar1[1] - fVar72;
      fVar65 = pfVar1[2] - fVar72;
      fVar66 = pfVar1[3] - fVar72;
      pfVar1 = (float *)(uVar25 + 0x50 + lVar23);
      fVar76 = *pfVar1 - fVar88;
      fVar77 = pfVar1[1] - fVar88;
      fVar78 = pfVar1[2] - fVar88;
      fVar79 = pfVar1[3] - fVar88;
      pfVar1 = (float *)(uVar25 + 0x60 + lVar23);
      fVar32 = *pfVar1 - fVar46;
      fVar42 = pfVar1[1] - fVar46;
      fVar44 = pfVar1[2] - fVar46;
      fVar46 = pfVar1[3] - fVar46;
      pfVar1 = (float *)(uVar25 + 0x70 + lVar23);
      fVar67 = *pfVar1 - fVar72;
      fVar70 = pfVar1[1] - fVar72;
      fVar71 = pfVar1[2] - fVar72;
      fVar72 = pfVar1[3] - fVar72;
      pfVar1 = (float *)(uVar25 + 0x80 + lVar23);
      fVar83 = *pfVar1 - fVar88;
      fVar85 = pfVar1[1] - fVar88;
      fVar86 = pfVar1[2] - fVar88;
      fVar88 = pfVar1[3] - fVar88;
      fVar96 = fVar32 - fVar141;
      fVar99 = fVar42 - fVar142;
      fVar102 = fVar44 - fVar143;
      fVar104 = fVar46 - fVar144;
      fVar125 = fVar67 - fVar107;
      fVar126 = fVar70 - fVar109;
      fVar127 = fVar71 - fVar111;
      fVar128 = fVar72 - fVar113;
      fVar116 = fVar83 - fVar129;
      fVar119 = fVar85 - fVar131;
      fVar121 = fVar86 - fVar133;
      fVar123 = fVar88 - fVar135;
      fVar87 = *(float *)(ray + k * 4 + 0x50);
      fVar98 = *(float *)(ray + k * 4 + 0x60);
      fVar101 = *(float *)(ray + k * 4 + 0x40);
      fVar137 = (fVar125 * (fVar129 + fVar83) - (fVar107 + fVar67) * fVar116) * fVar101 +
                ((fVar141 + fVar32) * fVar116 - (fVar129 + fVar83) * fVar96) * fVar87 +
                (fVar96 * (fVar107 + fVar67) - (fVar141 + fVar32) * fVar125) * fVar98;
      fVar138 = (fVar126 * (fVar131 + fVar85) - (fVar109 + fVar70) * fVar119) * fVar101 +
                ((fVar142 + fVar42) * fVar119 - (fVar131 + fVar85) * fVar99) * fVar87 +
                (fVar99 * (fVar109 + fVar70) - (fVar142 + fVar42) * fVar126) * fVar98;
      fVar139 = (fVar127 * (fVar133 + fVar86) - (fVar111 + fVar71) * fVar121) * fVar101 +
                ((fVar143 + fVar44) * fVar121 - (fVar133 + fVar86) * fVar102) * fVar87 +
                (fVar102 * (fVar111 + fVar71) - (fVar143 + fVar44) * fVar127) * fVar98;
      fVar140 = (fVar128 * (fVar135 + fVar88) - (fVar113 + fVar72) * fVar123) * fVar101 +
                ((fVar144 + fVar46) * fVar123 - (fVar135 + fVar88) * fVar104) * fVar87 +
                (fVar104 * (fVar113 + fVar72) - (fVar144 + fVar46) * fVar128) * fVar98;
      fVar47 = fVar141 - fVar31;
      fVar57 = fVar142 - fVar41;
      fVar58 = fVar143 - fVar43;
      fVar59 = fVar144 - fVar45;
      fVar90 = fVar107 - fVar60;
      fVar92 = fVar109 - fVar64;
      fVar93 = fVar111 - fVar65;
      fVar94 = fVar113 - fVar66;
      fVar117 = fVar129 - fVar76;
      fVar120 = fVar131 - fVar77;
      fVar122 = fVar133 - fVar78;
      fVar124 = fVar135 - fVar79;
      auVar73._0_4_ =
           (fVar90 * (fVar129 + fVar76) - (fVar107 + fVar60) * fVar117) * fVar101 +
           ((fVar141 + fVar31) * fVar117 - (fVar129 + fVar76) * fVar47) * fVar87 +
           (fVar47 * (fVar107 + fVar60) - (fVar141 + fVar31) * fVar90) * fVar98;
      auVar73._4_4_ =
           (fVar92 * (fVar131 + fVar77) - (fVar109 + fVar64) * fVar120) * fVar101 +
           ((fVar142 + fVar41) * fVar120 - (fVar131 + fVar77) * fVar57) * fVar87 +
           (fVar57 * (fVar109 + fVar64) - (fVar142 + fVar41) * fVar92) * fVar98;
      auVar73._8_4_ =
           (fVar93 * (fVar133 + fVar78) - (fVar111 + fVar65) * fVar122) * fVar101 +
           ((fVar143 + fVar43) * fVar122 - (fVar133 + fVar78) * fVar58) * fVar87 +
           (fVar58 * (fVar111 + fVar65) - (fVar143 + fVar43) * fVar93) * fVar98;
      auVar73._12_4_ =
           (fVar94 * (fVar135 + fVar79) - (fVar113 + fVar66) * fVar124) * fVar101 +
           ((fVar144 + fVar45) * fVar124 - (fVar135 + fVar79) * fVar59) * fVar87 +
           (fVar59 * (fVar113 + fVar66) - (fVar144 + fVar45) * fVar94) * fVar98;
      fVar97 = fVar31 - fVar32;
      fVar100 = fVar41 - fVar42;
      fVar103 = fVar43 - fVar44;
      fVar105 = fVar45 - fVar46;
      fVar108 = fVar60 - fVar67;
      fVar110 = fVar64 - fVar70;
      fVar112 = fVar65 - fVar71;
      fVar114 = fVar66 - fVar72;
      fVar130 = fVar76 - fVar83;
      fVar132 = fVar77 - fVar85;
      fVar134 = fVar78 - fVar86;
      fVar136 = fVar79 - fVar88;
      auVar63._0_4_ =
           (fVar108 * (fVar83 + fVar76) - (fVar67 + fVar60) * fVar130) * fVar101 +
           ((fVar32 + fVar31) * fVar130 - (fVar83 + fVar76) * fVar97) * fVar87 +
           (fVar97 * (fVar67 + fVar60) - (fVar32 + fVar31) * fVar108) * fVar98;
      auVar63._4_4_ =
           (fVar110 * (fVar85 + fVar77) - (fVar70 + fVar64) * fVar132) * fVar101 +
           ((fVar42 + fVar41) * fVar132 - (fVar85 + fVar77) * fVar100) * fVar87 +
           (fVar100 * (fVar70 + fVar64) - (fVar42 + fVar41) * fVar110) * fVar98;
      auVar63._8_4_ =
           (fVar112 * (fVar86 + fVar78) - (fVar71 + fVar65) * fVar134) * fVar101 +
           ((fVar44 + fVar43) * fVar134 - (fVar86 + fVar78) * fVar103) * fVar87 +
           (fVar103 * (fVar71 + fVar65) - (fVar44 + fVar43) * fVar112) * fVar98;
      auVar63._12_4_ =
           (fVar114 * (fVar88 + fVar79) - (fVar72 + fVar66) * fVar136) * fVar101 +
           ((fVar46 + fVar45) * fVar136 - (fVar88 + fVar79) * fVar105) * fVar87 +
           (fVar105 * (fVar72 + fVar66) - (fVar46 + fVar45) * fVar114) * fVar98;
      fVar32 = auVar73._0_4_ + fVar137 + auVar63._0_4_;
      fVar41 = auVar73._4_4_ + fVar138 + auVar63._4_4_;
      fVar42 = auVar73._8_4_ + fVar139 + auVar63._8_4_;
      fVar43 = auVar73._12_4_ + fVar140 + auVar63._12_4_;
      auVar35._4_4_ = fVar138;
      auVar35._0_4_ = fVar137;
      auVar35._8_4_ = fVar139;
      auVar35._12_4_ = fVar140;
      auVar50 = minps(auVar35,auVar73);
      auVar50 = minps(auVar50,auVar63);
      auVar68._4_4_ = fVar138;
      auVar68._0_4_ = fVar137;
      auVar68._8_4_ = fVar139;
      auVar68._12_4_ = fVar140;
      auVar33 = maxps(auVar68,auVar73);
      auVar33 = maxps(auVar33,auVar63);
      fVar46 = ABS(fVar32) * 1.1920929e-07;
      fVar72 = ABS(fVar41) * 1.1920929e-07;
      fVar88 = ABS(fVar42) * 1.1920929e-07;
      fVar31 = ABS(fVar43) * 1.1920929e-07;
      auVar69._4_4_ = -(uint)(auVar33._4_4_ <= fVar72);
      auVar69._0_4_ = -(uint)(auVar33._0_4_ <= fVar46);
      auVar69._8_4_ = -(uint)(auVar33._8_4_ <= fVar88);
      auVar69._12_4_ = -(uint)(auVar33._12_4_ <= fVar31);
      auVar36._4_4_ = -(uint)(-fVar72 <= auVar50._4_4_);
      auVar36._0_4_ = -(uint)(-fVar46 <= auVar50._0_4_);
      auVar36._8_4_ = -(uint)(-fVar88 <= auVar50._8_4_);
      auVar36._12_4_ = -(uint)(-fVar31 <= auVar50._12_4_);
      auVar69 = auVar69 | auVar36;
      iVar21 = movmskps((int)local_a70,auVar69);
      if (iVar21 != 0) {
        auVar91._0_4_ = fVar90 * fVar130 - fVar117 * fVar108;
        auVar91._4_4_ = fVar92 * fVar132 - fVar120 * fVar110;
        auVar91._8_4_ = fVar93 * fVar134 - fVar122 * fVar112;
        auVar91._12_4_ = fVar94 * fVar136 - fVar124 * fVar114;
        auVar37._4_4_ = -(uint)(ABS(fVar92 * fVar119) < ABS(fVar120 * fVar110));
        auVar37._0_4_ = -(uint)(ABS(fVar90 * fVar116) < ABS(fVar117 * fVar108));
        auVar37._8_4_ = -(uint)(ABS(fVar93 * fVar121) < ABS(fVar122 * fVar112));
        auVar37._12_4_ = -(uint)(ABS(fVar94 * fVar123) < ABS(fVar124 * fVar114));
        auVar18._4_4_ = fVar126 * fVar120 - fVar92 * fVar119;
        auVar18._0_4_ = fVar125 * fVar117 - fVar90 * fVar116;
        auVar18._8_4_ = fVar127 * fVar122 - fVar93 * fVar121;
        auVar18._12_4_ = fVar128 * fVar124 - fVar94 * fVar123;
        local_898 = blendvps(auVar91,auVar18,auVar37);
        auVar118._0_4_ = fVar117 * fVar97 - fVar47 * fVar130;
        auVar118._4_4_ = fVar120 * fVar100 - fVar57 * fVar132;
        auVar118._8_4_ = fVar122 * fVar103 - fVar58 * fVar134;
        auVar118._12_4_ = fVar124 * fVar105 - fVar59 * fVar136;
        auVar38._4_4_ = -(uint)(ABS(fVar120 * fVar99) < ABS(fVar57 * fVar132));
        auVar38._0_4_ = -(uint)(ABS(fVar117 * fVar96) < ABS(fVar47 * fVar130));
        auVar38._8_4_ = -(uint)(ABS(fVar122 * fVar102) < ABS(fVar58 * fVar134));
        auVar38._12_4_ = -(uint)(ABS(fVar124 * fVar104) < ABS(fVar59 * fVar136));
        auVar17._4_4_ = fVar119 * fVar57 - fVar120 * fVar99;
        auVar17._0_4_ = fVar116 * fVar47 - fVar117 * fVar96;
        auVar17._8_4_ = fVar121 * fVar58 - fVar122 * fVar102;
        auVar17._12_4_ = fVar123 * fVar59 - fVar124 * fVar104;
        local_888 = blendvps(auVar118,auVar17,auVar38);
        auVar74._0_4_ = fVar96 * fVar90 - fVar47 * fVar125;
        auVar74._4_4_ = fVar99 * fVar92 - fVar57 * fVar126;
        auVar74._8_4_ = fVar102 * fVar93 - fVar58 * fVar127;
        auVar74._12_4_ = fVar104 * fVar94 - fVar59 * fVar128;
        auVar81._0_4_ = fVar47 * fVar108 - fVar90 * fVar97;
        auVar81._4_4_ = fVar57 * fVar110 - fVar92 * fVar100;
        auVar81._8_4_ = fVar58 * fVar112 - fVar93 * fVar103;
        auVar81._12_4_ = fVar59 * fVar114 - fVar94 * fVar105;
        auVar39._4_4_ = -(uint)(ABS(fVar57 * fVar126) < ABS(fVar92 * fVar100));
        auVar39._0_4_ = -(uint)(ABS(fVar47 * fVar125) < ABS(fVar90 * fVar97));
        auVar39._8_4_ = -(uint)(ABS(fVar58 * fVar127) < ABS(fVar93 * fVar103));
        auVar39._12_4_ = -(uint)(ABS(fVar59 * fVar128) < ABS(fVar94 * fVar105));
        local_878 = blendvps(auVar81,auVar74,auVar39);
        fVar45 = fVar101 * local_898._0_4_ + fVar87 * local_888._0_4_ + fVar98 * local_878._0_4_;
        fVar47 = fVar101 * local_898._4_4_ + fVar87 * local_888._4_4_ + fVar98 * local_878._4_4_;
        fVar57 = fVar101 * local_898._8_4_ + fVar87 * local_888._8_4_ + fVar98 * local_878._8_4_;
        fVar58 = fVar101 * local_898._12_4_ + fVar87 * local_888._12_4_ + fVar98 * local_878._12_4_;
        fVar45 = fVar45 + fVar45;
        fVar47 = fVar47 + fVar47;
        fVar57 = fVar57 + fVar57;
        fVar58 = fVar58 + fVar58;
        auVar53._0_4_ = fVar129 * local_878._0_4_;
        auVar53._4_4_ = fVar131 * local_878._4_4_;
        auVar53._8_4_ = fVar133 * local_878._8_4_;
        auVar53._12_4_ = fVar135 * local_878._12_4_;
        fVar98 = fVar141 * local_898._0_4_ + fVar107 * local_888._0_4_ + auVar53._0_4_;
        fVar101 = fVar142 * local_898._4_4_ + fVar109 * local_888._4_4_ + auVar53._4_4_;
        fVar31 = fVar143 * local_898._8_4_ + fVar111 * local_888._8_4_ + auVar53._8_4_;
        fVar44 = fVar144 * local_898._12_4_ + fVar113 * local_888._12_4_ + auVar53._12_4_;
        auVar16._4_4_ = fVar47;
        auVar16._0_4_ = fVar45;
        auVar16._8_4_ = fVar57;
        auVar16._12_4_ = fVar58;
        auVar50 = rcpps(auVar53,auVar16);
        fVar46 = auVar50._0_4_;
        fVar72 = auVar50._4_4_;
        fVar88 = auVar50._8_4_;
        fVar87 = auVar50._12_4_;
        local_8a8._0_4_ = ((1.0 - fVar45 * fVar46) * fVar46 + fVar46) * (fVar98 + fVar98);
        local_8a8._4_4_ = ((1.0 - fVar47 * fVar72) * fVar72 + fVar72) * (fVar101 + fVar101);
        local_8a8._8_4_ = ((1.0 - fVar57 * fVar88) * fVar88 + fVar88) * (fVar31 + fVar31);
        local_8a8._12_4_ = ((1.0 - fVar58 * fVar87) * fVar87 + fVar87) * (fVar44 + fVar44);
        fVar46 = *(float *)(ray + k * 4 + 0x80);
        fVar72 = *(float *)(ray + k * 4 + 0x30);
        auVar54._0_4_ =
             -(uint)(local_8a8._0_4_ <= fVar46 && fVar72 <= local_8a8._0_4_) & auVar69._0_4_;
        auVar54._4_4_ =
             -(uint)(local_8a8._4_4_ <= fVar46 && fVar72 <= local_8a8._4_4_) & auVar69._4_4_;
        auVar54._8_4_ =
             -(uint)(local_8a8._8_4_ <= fVar46 && fVar72 <= local_8a8._8_4_) & auVar69._8_4_;
        auVar54._12_4_ =
             -(uint)(local_8a8._12_4_ <= fVar46 && fVar72 <= local_8a8._12_4_) & auVar69._12_4_;
        iVar21 = movmskps(iVar21,auVar54);
        if ((iVar21 != 0) &&
           (auVar55._0_4_ = auVar54._0_4_ & -(uint)(fVar45 != 0.0),
           auVar55._4_4_ = auVar54._4_4_ & -(uint)(fVar47 != 0.0),
           auVar55._8_4_ = auVar54._8_4_ & -(uint)(fVar57 != 0.0),
           auVar55._12_4_ = auVar54._12_4_ & -(uint)(fVar58 != 0.0),
           uVar20 = movmskps(iVar21,auVar55), uVar20 != 0)) {
          auVar19._4_4_ = fVar41;
          auVar19._0_4_ = fVar32;
          auVar19._8_4_ = fVar42;
          auVar19._12_4_ = fVar43;
          pSVar12 = context->scene;
          auVar50 = rcpps(local_8a8,auVar19);
          fVar72 = auVar50._0_4_;
          fVar88 = auVar50._4_4_;
          fVar87 = auVar50._8_4_;
          fVar98 = auVar50._12_4_;
          fVar72 = (float)(-(uint)(1e-18 <= ABS(fVar32)) &
                          (uint)(((float)DAT_01f46a60 - fVar32 * fVar72) * fVar72 + fVar72));
          fVar88 = (float)(-(uint)(1e-18 <= ABS(fVar41)) &
                          (uint)((DAT_01f46a60._4_4_ - fVar41 * fVar88) * fVar88 + fVar88));
          fVar87 = (float)(-(uint)(1e-18 <= ABS(fVar42)) &
                          (uint)((DAT_01f46a60._8_4_ - fVar42 * fVar87) * fVar87 + fVar87));
          fVar98 = (float)(-(uint)(1e-18 <= ABS(fVar43)) &
                          (uint)((DAT_01f46a60._12_4_ - fVar43 * fVar98) * fVar98 + fVar98));
          auVar75._0_4_ = fVar137 * fVar72;
          auVar75._4_4_ = fVar138 * fVar88;
          auVar75._8_4_ = fVar139 * fVar87;
          auVar75._12_4_ = fVar140 * fVar98;
          local_8c8 = minps(auVar75,_DAT_01f46a60);
          auVar84._0_4_ = fVar72 * auVar73._0_4_;
          auVar84._4_4_ = fVar88 * auVar73._4_4_;
          auVar84._8_4_ = fVar87 * auVar73._8_4_;
          auVar84._12_4_ = fVar98 * auVar73._12_4_;
          local_8b8 = minps(auVar84,_DAT_01f46a60);
          uVar27 = (ulong)(uVar20 & 0xff);
          do {
            uVar15 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            local_808 = *(uint *)(lVar23 + uVar25 + 0x90 + uVar15 * 4);
            pGVar13 = (pSVar12->geometries).items[local_808].ptr;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_838 = *(undefined4 *)(local_8c8 + uVar15 * 4);
                uVar10 = *(undefined4 *)(local_8b8 + uVar15 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar15 * 4);
                args.context = context->user;
                local_818 = *(undefined4 *)(lVar23 + uVar25 + 0xa0 + uVar15 * 4);
                local_828._4_4_ = uVar10;
                local_828._0_4_ = uVar10;
                local_828._8_4_ = uVar10;
                local_828._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_898 + uVar15 * 4);
                local_858 = *(undefined4 *)(local_888 + uVar15 * 4);
                uVar11 = *(undefined4 *)(local_878 + uVar15 * 4);
                local_848._4_4_ = uVar11;
                local_848._0_4_ = uVar11;
                local_848._8_4_ = uVar11;
                local_848._12_4_ = uVar11;
                local_868[0] = (RTCHitN)(char)uVar10;
                local_868[1] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_868[2] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_868[3] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_868[4] = (RTCHitN)(char)uVar10;
                local_868[5] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_868[6] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_868[7] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_868[8] = (RTCHitN)(char)uVar10;
                local_868[9] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_868[10] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_868[0xb] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                local_868[0xc] = (RTCHitN)(char)uVar10;
                local_868[0xd] = (RTCHitN)(char)((uint)uVar10 >> 8);
                local_868[0xe] = (RTCHitN)(char)((uint)uVar10 >> 0x10);
                local_868[0xf] = (RTCHitN)(char)((uint)uVar10 >> 0x18);
                uStack_854 = local_858;
                uStack_850 = local_858;
                uStack_84c = local_858;
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                uStack_814 = local_818;
                uStack_810 = local_818;
                uStack_80c = local_818;
                uStack_804 = local_808;
                uStack_800 = local_808;
                uStack_7fc = local_808;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                local_a88 = *local_a78;
                args.valid = (int *)local_a88;
                args.geometryUserPtr = pGVar13->userPtr;
                args.hit = local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar13->occlusionFilterN)(&args);
                }
                if (local_a88 == (undefined1  [16])0x0) {
                  auVar56._8_4_ = 0xffffffff;
                  auVar56._0_8_ = 0xffffffffffffffff;
                  auVar56._12_4_ = 0xffffffff;
                  auVar56 = auVar56 ^ _DAT_01f46b70;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var14)(&args);
                  }
                  auVar40._0_4_ = -(uint)(local_a88._0_4_ == 0);
                  auVar40._4_4_ = -(uint)(local_a88._4_4_ == 0);
                  auVar40._8_4_ = -(uint)(local_a88._8_4_ == 0);
                  auVar40._12_4_ = -(uint)(local_a88._12_4_ == 0);
                  auVar56 = auVar40 ^ _DAT_01f46b70;
                  auVar50 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar40);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
                }
                if ((_DAT_01f46b40 & auVar56) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar46;
                  goto LAB_006f1d12;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_006f1deb;
            }
LAB_006f1d12:
            uVar27 = uVar27 ^ 1L << (uVar15 & 0x3f);
          } while (uVar27 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }